

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundBetweenExpression::Deserialize(BoundBetweenExpression *this,Deserializer *deserializer)

{
  undefined1 uVar1;
  int iVar2;
  uint uVar3;
  BoundBetweenExpression *this_00;
  pointer pBVar4;
  byte bVar5;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var6;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var7;
  unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
  result;
  _Head_base<0UL,_duckdb::BoundBetweenExpression_*,_false> local_38;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_30;
  
  this_00 = (BoundBetweenExpression *)operator_new(0x78);
  BoundBetweenExpression(this_00);
  local_38._M_head_impl = this_00;
  pBVar4 = unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
                         *)&local_38);
  iVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"input");
  bVar5 = (byte)iVar2;
  if (bVar5 == 0) {
    _Var6._M_head_impl =
         (pBVar4->input).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar4->input).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    if (_Var6._M_head_impl != (Expression *)0x0) goto LAB_010a883f;
    bVar5 = 0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar2 == '\0') {
      _Var7._M_head_impl = (Expression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      Expression::Deserialize((Expression *)&stack0xffffffffffffffd0,deserializer);
      _Var7._M_head_impl = local_30._M_head_impl;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var6._M_head_impl =
         (pBVar4->input).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar4->input).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var7._M_head_impl;
    if (_Var6._M_head_impl == (Expression *)0x0) {
      bVar5 = 1;
    }
    else {
LAB_010a883f:
      (*((_Var6._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar5);
  pBVar4 = unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
                         *)&local_38);
  iVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"lower");
  bVar5 = (byte)iVar2;
  if (bVar5 == 0) {
    _Var6._M_head_impl =
         (pBVar4->lower).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar4->lower).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    if (_Var6._M_head_impl != (Expression *)0x0) goto LAB_010a88e4;
    bVar5 = 0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar2 == '\0') {
      _Var7._M_head_impl = (Expression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      Expression::Deserialize((Expression *)&stack0xffffffffffffffd0,deserializer);
      _Var7._M_head_impl = local_30._M_head_impl;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var6._M_head_impl =
         (pBVar4->lower).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar4->lower).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var7._M_head_impl;
    if (_Var6._M_head_impl == (Expression *)0x0) {
      bVar5 = 1;
    }
    else {
LAB_010a88e4:
      (*((_Var6._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar5);
  pBVar4 = unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
                         *)&local_38);
  iVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"upper");
  bVar5 = (byte)iVar2;
  if (bVar5 == 0) {
    _Var6._M_head_impl =
         (pBVar4->upper).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar4->upper).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    if (_Var6._M_head_impl == (Expression *)0x0) {
      bVar5 = 0;
      goto LAB_010a8994;
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar2 == '\0') {
      local_30._M_head_impl = (Expression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      Expression::Deserialize((Expression *)&stack0xffffffffffffffd0,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var6._M_head_impl =
         (pBVar4->upper).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar4->upper).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = local_30._M_head_impl;
    if (_Var6._M_head_impl == (Expression *)0x0) {
      bVar5 = 1;
      goto LAB_010a8994;
    }
  }
  (*((_Var6._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
LAB_010a8994:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar5);
  pBVar4 = unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
                         *)&local_38);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"lower_inclusive");
  if ((char)uVar3 == '\0') {
    uVar1 = false;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar2;
  }
  pBVar4->lower_inclusive = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pBVar4 = unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundBetweenExpression,_std::default_delete<duckdb::BoundBetweenExpression>,_true>
                         *)&local_38);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcc,"upper_inclusive");
  if ((char)uVar3 == '\0') {
    uVar1 = false;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar2;
  }
  pBVar4->upper_inclusive = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_38._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundBetweenExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<BoundBetweenExpression>(new BoundBetweenExpression());
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(200, "input", result->input);
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(201, "lower", result->lower);
	deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(202, "upper", result->upper);
	deserializer.ReadPropertyWithDefault<bool>(203, "lower_inclusive", result->lower_inclusive);
	deserializer.ReadPropertyWithDefault<bool>(204, "upper_inclusive", result->upper_inclusive);
	return std::move(result);
}